

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

bool CNscPStackEntry::IsAssignment(uchar *pauchData,size_t nDataSize)

{
  bool local_1a;
  bool local_19;
  NscPCodeHeader *pv;
  size_t nDataSize_local;
  uchar *pauchData_local;
  
  local_19 = false;
  if ((nDataSize != 0) && (local_19 = false, *(size_t *)pauchData == nDataSize)) {
    local_1a = false;
    if (0x13 < *(int *)(pauchData + 8)) {
      local_1a = *(int *)(pauchData + 8) < 0x20;
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

static bool IsAssignment (const unsigned char *pauchData, size_t nDataSize)
	{
		NscPCodeHeader *pv = (NscPCodeHeader *) pauchData;

		return nDataSize != 0 &&
			pv ->nOpSize == nDataSize &&
			(pv ->nOpCode >= NscPCode__First_Assignment &&
			pv ->nOpCode <= NscPCode__Last_Assignment);
	}